

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDComponentPtrPair __thiscall ON_SubDVertex::BoundaryEdgePair(ON_SubDVertex *this)

{
  bool bVar1;
  ushort uVar2;
  ON_SubDComponentPtr OVar3;
  ON_SubDComponentPtr OVar4;
  ulong uVar5;
  ON_SubDComponentPtr OVar6;
  ulong uVar7;
  ON_SubDEdge *this_00;
  uint uVar8;
  ON_SubDComponentPtrPair OVar9;
  ON__UINT_PTR local_38;
  
  local_38 = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
  OVar6.m_ptr = ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
  if ((this->m_edges != (ON_SubDEdgePtr *)0x0) && (uVar2 = this->m_edge_count, 1 < uVar2)) {
    for (uVar7 = 0; uVar7 < uVar2; uVar7 = uVar7 + 1) {
      uVar5 = this->m_edges[uVar7].m_ptr;
      this_00 = (ON_SubDEdge *)(uVar5 & 0xfffffffffffffff8);
      if ((this_00 != (ON_SubDEdge *)0x0) &&
         (bVar1 = ON_SubDEdge::HasBoundaryEdgeTopology(this_00), bVar1)) {
        uVar8 = (uint)uVar5 & 1;
        if (this_00->m_vertex[uVar8] != this) {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                     ,0x16fd,"","m_edges[vei] has incorrect edge orientation flag.");
          OVar3 = ON_SubDComponentPtrPair::Null.m_pair[0];
          OVar4 = ON_SubDComponentPtrPair::Null.m_pair[1];
          if (this_00->m_vertex[uVar8 ^ 1] != this) goto LAB_005d238d;
          uVar5 = uVar5 & 0xfffffffffffffff9 ^ 1;
        }
        if (OVar6.m_ptr < 8 || (OVar6.m_ptr & 6) == 0) {
          if (uVar5 < 8) {
            OVar6 = (ON_SubDComponentPtr)0;
          }
          else {
            OVar6.m_ptr = uVar5 & 0xfffffffffffffff9 | 4;
          }
        }
        else {
          OVar3.m_ptr = ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
          OVar4.m_ptr = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
          if (7 < local_38 && (local_38 & 6) != 0) goto LAB_005d238d;
          if (uVar5 < 8) {
            local_38 = 0;
          }
          else {
            local_38 = uVar5 & 0xfffffffffffffff9 | 4;
          }
        }
      }
      uVar2 = this->m_edge_count;
    }
  }
  OVar3.m_ptr = ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
  OVar4.m_ptr = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
  if (7 < local_38 && (local_38 & 6) != 0) {
    OVar3.m_ptr = OVar6.m_ptr;
    OVar4.m_ptr = local_38;
  }
LAB_005d238d:
  OVar9.m_pair[1].m_ptr = OVar4.m_ptr;
  OVar9.m_pair[0].m_ptr = OVar3.m_ptr;
  return (ON_SubDComponentPtrPair)OVar9.m_pair;
}

Assistant:

const ON_SubDComponentPtrPair ON_SubDVertex::BoundaryEdgePair() const
{
  ON_SubDComponentPtrPair epair = ON_SubDComponentPtrPair::Null;
  if (nullptr != m_edges && m_edge_count >= 2)
  {
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      ON_SubDEdgePtr eptr = m_edges[vei];
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr.m_ptr);
      if (nullptr == e)
        continue;
      if (false == e->HasBoundaryEdgeTopology())
        continue;
      const ON__UINT_PTR edir = ON_SUBD_EDGE_DIRECTION(eptr.m_ptr);
      if (this != e->m_vertex[edir])
      {
        // m_edges[vei] is corrupt ...
        ON_SUBD_ERROR("m_edges[vei] has incorrect edge orientation flag.");
        if (this == e->m_vertex[1 - edir])
          eptr = eptr.Reversed(); // we can still return the requested information.
        else
          return ON_SubDComponentPtrPair::Null;
      }
      if (epair.m_pair[0].IsNull())
        epair.m_pair[0] = ON_SubDComponentPtr::Create(eptr);
      else if (epair.m_pair[1].IsNull())
        epair.m_pair[1] = ON_SubDComponentPtr::Create(eptr);
      else
        return ON_SubDComponentPtrPair::Null; // 3 or more boundary edges
    }
  }
  return (epair.m_pair[1].IsNotNull()) ? epair : ON_SubDComponentPtrPair::Null;
}